

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  size_t sVar1;
  FILE *in_RDX;
  char *__s_00;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  string result;
  string src_data;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (argc < 2) {
    __s_00 = (char *)0x0;
LAB_00105c38:
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40.field_2._M_local_buf[0] = '\0';
    local_40._M_string_length = 0;
    phosg::read_all_abi_cxx11_(&local_80,_stdin,in_RDX);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80);
    uVar2 = local_80.field_2._M_allocated_capacity;
    _Var3._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_00105c78;
  }
  else {
    __s = argv[1];
    if (argc == 2) {
      __s_00 = (char *)0x0;
    }
    else {
      if (3 < (uint)argc) {
        main_cold_1();
        return 1;
      }
      __s_00 = argv[2];
    }
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40._M_string_length = 0;
    local_40.field_2._M_local_buf[0] = '\0';
    if ((__s == (char *)0x0) || ((*__s == '-' && (__s[1] == '\0')))) goto LAB_00105c38;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,__s,__s + sVar1);
    phosg::load_file(&local_80,&local_60);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    uVar2 = local_60.field_2._M_allocated_capacity;
    _Var3._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) goto LAB_00105c78;
  }
  operator_delete(_Var3._M_p,uVar2 + 1);
LAB_00105c78:
  phosg::parse_data_string((string *)&local_80,&local_40,(string *)0x0,0);
  if ((__s_00 == (char *)0x0) || ((*__s_00 == '-' && (__s_00[1] == '\0')))) {
    phosg::fwritex(_stdout,&local_80);
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    sVar1 = strlen(__s_00);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,__s_00,__s_00 + sVar1);
    phosg::save_file(&local_60,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  const char* src_filename = (argc > 1) ? argv[1] : nullptr;
  const char* dst_filename = (argc > 2) ? argv[2] : nullptr;
  if (argc > 3) {
    fprintf(stderr, "too many positional arguments given\n");
    return 1;
  }

  string src_data;
  if (!src_filename || !strcmp(src_filename, "-")) {
    src_data = read_all(stdin);
  } else {
    src_data = load_file(src_filename);
  }

  string result = parse_data_string(src_data);

  if (!dst_filename || !strcmp(dst_filename, "-")) {
    fwritex(stdout, result);
  } else {
    save_file(dst_filename, result);
  }

  return 0;
}